

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * czh::utils::colorify
                   (string *__return_storage_ptr__,string *str,Color with_color,ColorType type)

{
  CzhColor CVar1;
  allocator<char> local_171;
  source_location local_170;
  allocator<char> local_161;
  string local_160;
  source_location local_140;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ColorType local_20;
  Color local_1c;
  ColorType type_local;
  Color with_color_local;
  string *str_local;
  
  local_20 = type;
  local_1c = with_color;
  _type_local = str;
  str_local = __return_storage_ptr__;
  if (with_color == no_color) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,str);
  }
  else {
    CVar1 = get_color(type);
    switch(CVar1) {
    case BLUE:
      std::operator+(&local_90,"\x1b[34m",_type_local);
      std::operator+(__return_storage_ptr__,&local_90,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_90);
      break;
    case LIGHT_BLUE:
      std::operator+(&local_70,"\x1b[36m",_type_local);
      std::operator+(__return_storage_ptr__,&local_70,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_70);
      break;
    case GREEN:
      std::operator+(&local_b0,"\x1b[32m",_type_local);
      std::operator+(__return_storage_ptr__,&local_b0,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_b0);
      break;
    case PURPLE:
      std::operator+(&local_40,"\x1b[35m",_type_local);
      std::operator+(__return_storage_ptr__,&local_40,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_40);
      break;
    case YELLOW:
      std::operator+(&local_d0,"\x1b[33m",_type_local);
      std::operator+(__return_storage_ptr__,&local_d0,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_d0);
      break;
    case WHITE:
      std::operator+(&local_f0,"\x1b[37m",_type_local);
      std::operator+(__return_storage_ptr__,&local_f0,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_f0);
      break;
    case RED:
      std::operator+(&local_110,"\x1b[31m",_type_local);
      std::operator+(__return_storage_ptr__,&local_110,"\x1b[0m");
      std::__cxx11::string::~string((string *)&local_110);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"Something unreachable.",&local_131);
      local_140._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00276f18;
      czh::error::czh_unreachable(&local_130,&local_140);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Something unreachable.",&local_161);
      local_170._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00276f30;
      czh::error::czh_unreachable(&local_160,&local_170);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_171);
      std::allocator<char>::~allocator(&local_171);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string colorify(const std::string &str, Color with_color, ColorType type)
  {
    if (with_color == Color::no_color) return str;
    switch (get_color(type))
    {
      case CzhColor::PURPLE:
        return "\033[35m" + str + "\033[0m";
      case CzhColor::LIGHT_BLUE:
        return "\033[36m" + str + "\033[0m";
      case CzhColor::BLUE:
        return "\033[34m" + str + "\033[0m";
      case CzhColor::GREEN:
        return "\033[32m" + str + "\033[0m";
      case CzhColor::YELLOW:
        return "\033[33m" + str + "\033[0m";
      case CzhColor::WHITE:
        return "\033[37m" + str + "\033[0m";
      case CzhColor::RED:
        return "\033[31m" + str + "\033[0m";
      default:
        error::czh_unreachable();
    }
    error::czh_unreachable();
    return "";
  }